

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

void __thiscall miniros::NodeHandle::NodeHandle(NodeHandle *this,string *ns,M_string *remappings)

{
  string *psVar1;
  ulong uVar2;
  char *pcVar3;
  string *in_RSI;
  string *in_RDI;
  string tilde_resolved_ns;
  M_string *in_stack_000000d8;
  NodeHandle *in_stack_000000e0;
  undefined1 _remap;
  string local_58 [32];
  string local_38 [40];
  string *local_10;
  
  local_10 = in_RSI;
  psVar1 = this_node::getNamespace_abi_cxx11_();
  std::__cxx11::string::string(in_RDI,(string *)psVar1);
  std::__cxx11::string::string(in_RDI + 0x20);
  _remap = (undefined1)((ulong)(in_RDI + 0x40) >> 0x38);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x47779d);
  psVar1 = (string *)(in_RDI + 0x70);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x4777b0);
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  std::__cxx11::string::string(local_38);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
    if (*pcVar3 == '~') {
      names::resolve(psVar1,(bool)_remap);
      std::__cxx11::string::operator=(local_38,local_58);
      std::__cxx11::string::~string(local_58);
      goto LAB_00477882;
    }
  }
  std::__cxx11::string::operator=(local_38,local_10);
LAB_00477882:
  construct((NodeHandle *)remappings,(string *)tilde_resolved_ns.field_2._8_8_,
            (bool)tilde_resolved_ns.field_2._M_local_buf[7]);
  initRemappings(in_stack_000000e0,in_stack_000000d8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

NodeHandle::NodeHandle(const std::string& ns, const M_string& remappings)
  : namespace_(this_node::getNamespace())
  , callback_queue_(0)
  , collection_(0)
{
  std::string tilde_resolved_ns;
  if (!ns.empty() && ns[0] == '~')// starts with tilde
    tilde_resolved_ns = names::resolve(ns);
  else
    tilde_resolved_ns = ns;

  construct(tilde_resolved_ns, true);

  initRemappings(remappings);
}